

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O0

Lazy<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
__thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::WRRLoadBlancer::
operator()(WRRLoadBlancer *this,
          load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool> *load_blancer)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  size_type sVar3;
  long *plVar4;
  vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
  *this_00;
  void *this_01;
  long in_RDX;
  undefined8 in_RSI;
  LazyBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_false>
  in_RDI;
  int selected;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  WRRLoadBlancer *in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int local_58;
  
  puVar2 = (undefined8 *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::
    LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
    ::get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = operator();
    puVar2[1] = operator();
    plVar4 = puVar2 + 8;
    puVar2[9] = in_RSI;
    *plVar4 = in_RDX;
    async_simple::coro::detail::
    LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
    ::LazyPromise((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    async_simple::coro::detail::
    LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
    ::get_return_object((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x51));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x51));
      local_58 = select_host_with_weight_round_robin(in_stack_ffffffffffffff08);
      if (local_58 == -1) {
        local_58 = 0;
      }
      *(int *)(puVar2[9] + 0x20) = local_58;
      this_00 = (vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
                 *)(*plVar4 + 0x158);
      this_01 = (void *)(long)local_58;
      sVar3 = std::
              vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
              ::size((vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
                      *)(*plVar4 + 0x158));
      std::
      vector<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_std::allocator<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>_>
      ::operator[](this_00,(ulong)this_01 % sVar3);
      async_simple::coro::detail::
      LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
      ::
      return_value<const_std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_&>
                ((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
      bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                        ((FinalAwaiter *)((long)puVar2 + 0x52));
      if (bVar1) {
        async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                  ((FinalAwaiter *)((long)puVar2 + 0x52));
        async_simple::coro::detail::
        LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
        ::~LazyPromise((LazyPromise<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
                        *)0x451d0b);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0x58);
        }
      }
      else {
        *puVar2 = 0;
        *(undefined1 *)(puVar2 + 10) = 1;
        coro_io::load_blancer(this_01,this_00);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)(puVar2 + 10) = 0;
      coro_io::load_blancer(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
  }
  return (Lazy<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
          )in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::shared_ptr<client_pool_t>> operator()(
        const load_blancer& load_blancer) {
      int selected = select_host_with_weight_round_robin();
      if (selected == -1) {
        selected = 0;
      }

      wrr_current_ = selected;
      co_return load_blancer
          .client_pools_[selected % load_blancer.client_pools_.size()];
    }